

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

int IsValidSimpleFormat(WebPDemuxer *dmux)

{
  Frame *pFVar1;
  int iVar2;
  
  if (dmux->state_ == WEBP_DEMUX_PARSING_HEADER) {
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    if ((((0 < dmux->canvas_width_) && (0 < dmux->canvas_height_)) &&
        (pFVar1 = dmux->frames_, dmux->state_ != WEBP_DEMUX_DONE || pFVar1 != (Frame *)0x0)) &&
       (0 < pFVar1->width_)) {
      return (int)(0 < pFVar1->height_);
    }
  }
  return iVar2;
}

Assistant:

static int IsValidSimpleFormat(const WebPDemuxer* const dmux) {
  const Frame* const frame = dmux->frames_;
  if (dmux->state_ == WEBP_DEMUX_PARSING_HEADER) return 1;

  if (dmux->canvas_width_ <= 0 || dmux->canvas_height_ <= 0) return 0;
  if (dmux->state_ == WEBP_DEMUX_DONE && frame == NULL) return 0;

  if (frame->width_ <= 0 || frame->height_ <= 0) return 0;
  return 1;
}